

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_interp_CC_to_Centroid
               (MultiFab *cent,MultiFab *cc,int scomp,int dcomp,int ncomp,Geometry *geom)

{
  int iVar1;
  bool bVar2;
  FabFactory<amrex::FArrayBox> *pFVar3;
  FabArrayBase *fabarray_;
  int in_R8D;
  Box thread_box;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  Array4<const_double> *ccfab_1;
  Array4<const_double> *locfab;
  Array4<const_amrex::EBCellFlag> *flagfab;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_double> *ccfab;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType *fabtyp;
  Array4<double> *centfab;
  Box *vbx;
  MFIter mfi;
  MFItInfo mfi_info;
  MultiCutFab *loc;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  MFIter *in_stack_fffffffffffff968;
  MultiCutFab *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff980;
  int in_stack_fffffffffffff988;
  int in_stack_fffffffffffff98c;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff990;
  Geometry *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  BATType in_stack_fffffffffffff9c4;
  undefined8 in_stack_fffffffffffff9c8;
  iterator local_628;
  iterator local_610;
  undefined1 local_5f8 [40];
  undefined1 *local_5d0;
  undefined1 local_5c8 [64];
  undefined1 *local_588;
  undefined1 local_580 [16];
  Box *in_stack_fffffffffffffa90;
  EBCellFlagFab *in_stack_fffffffffffffa98;
  undefined1 local_538 [64];
  undefined1 *local_4f8;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  FabArray<amrex::FArrayBox> *local_4e0;
  int local_4d8;
  unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_4cc;
  int local_4c4;
  FArrayBox *local_4c0;
  int local_4b8;
  FArrayBox *local_4b0;
  int local_4a8;
  undefined1 local_4a0 [236];
  FArrayBox *local_3b4 [3];
  FArrayBox **local_398;
  MFIter local_390;
  MFItInfo local_32c;
  MultiCutFab *local_318;
  FabArray<amrex::EBCellFlagFab> *local_310;
  FabArrayBase *local_308;
  undefined4 local_2f4;
  FArrayBox *local_2d8;
  int local_2d0;
  FArrayBox **local_2c8;
  int local_2bc;
  int iStack_2b8;
  int local_2b4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b0;
  int local_2a8;
  FArrayBox **local_2a0;
  int local_294;
  int iStack_290;
  int local_28c;
  FabArray<amrex::FArrayBox> *local_288;
  int local_280;
  FArrayBox **local_278;
  int local_26c;
  int iStack_268;
  int local_264;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_260;
  int local_258;
  FArrayBox **local_250;
  int local_244;
  int iStack_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  long *local_228;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  long *local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  FabArray<amrex::FArrayBox> *local_1f8;
  undefined1 local_1f0 [64];
  undefined1 auStack_1b0 [64];
  undefined1 auStack_170 [64];
  undefined1 auStack_130 [68];
  int local_ec;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  long *local_d0;
  FabArray<amrex::FArrayBox> *local_c8;
  undefined4 local_bc;
  undefined4 *local_b8;
  undefined4 local_ac;
  undefined4 *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  undefined4 *local_88;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  FArrayBox **local_58;
  undefined4 local_4c;
  FArrayBox **local_48;
  undefined4 local_3c;
  FArrayBox **local_38;
  undefined4 local_2c;
  FArrayBox **local_28;
  undefined4 local_1c;
  FArrayBox **local_18;
  undefined4 local_c;
  FArrayBox **local_8;
  
  local_2f4 = in_R8D;
  pFVar3 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x115a0b2);
  fabarray_ = (FabArrayBase *)
              __dynamic_cast(pFVar3,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
  if (fabarray_ != (FabArrayBase *)0x0) {
    local_308 = fabarray_;
    local_310 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffff970);
    local_318 = EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_fffffffffffff970);
    MFItInfo::MFItInfo((MFItInfo *)in_stack_fffffffffffff980);
    MFItInfo::SetDynamic(&local_32c,true);
    MFIter::MFIter((MFIter *)in_stack_fffffffffffff9a0,fabarray_,
                   (MFItInfo *)in_stack_fffffffffffff990);
    while (bVar2 = MFIter::isValid(&local_390), bVar2) {
      MFIter::validbox((MFIter *)in_stack_fffffffffffff980);
      local_398 = local_3b4;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff980,
                 (MFIter *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                 (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
      local_4a0._224_8_ = local_4a0 + 0xa0;
      FabArray<amrex::EBCellFlagFab>::operator[]
                ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff970,
                 in_stack_fffffffffffff968);
      local_4a0._148_4_ =
           EBCellFlagFab::getType(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      local_4a0._152_8_ = local_4a0 + 0x94;
      if (local_4a0._148_4_ == covered) {
        local_2a0 = local_398;
        local_38 = local_398;
        local_3c = 0;
        local_294 = *(int *)local_398;
        local_48 = local_398;
        local_4c = 1;
        iStack_290 = *(int *)((long)local_398 + 4);
        local_4a0._120_8_ = *local_398;
        local_58 = local_398;
        local_5c = 2;
        local_4a0._128_4_ = *(undefined4 *)(local_398 + 1);
        local_250 = local_398;
        local_98 = (int *)((long)local_398 + 0xc);
        local_9c = 0;
        local_244 = *local_98;
        local_a8 = (undefined4 *)((long)local_398 + 0xc);
        local_ac = 1;
        iStack_240 = *(int *)(local_398 + 2);
        local_4a0._88_8_ = *(undefined8 *)local_98;
        local_b8 = (undefined4 *)((long)local_398 + 0xc);
        local_bc = 2;
        local_4a0._96_4_ = *(int *)((long)local_398 + 0x14);
        for (local_4a0._84_4_ = 0; iVar1 = local_4a0._128_4_, local_4a0._108_8_ = local_4a0._88_8_,
            local_4a0._116_4_ = local_4a0._96_4_, local_4a0._136_8_ = local_4a0._120_8_,
            local_4a0._144_4_ = local_4a0._128_4_,
            local_2b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0._120_8_,
            local_2a8 = local_4a0._128_4_, local_28c = local_4a0._128_4_,
            local_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0._88_8_,
            local_258 = local_4a0._96_4_, local_23c = local_4a0._96_4_,
            (int)local_4a0._84_4_ < local_2f4; local_4a0._84_4_ = local_4a0._84_4_ + 1) {
          while (local_4a0._80_4_ = iVar1, iVar1 = iStack_290,
                (int)local_4a0._80_4_ <= (int)local_4a0._96_4_) {
            while (local_4a0._76_4_ = iVar1, iVar1 = local_294, (int)local_4a0._76_4_ <= iStack_240)
            {
              while (local_4a0._72_4_ = iVar1, (int)local_4a0._72_4_ <= local_244) {
                local_210 = (long *)local_4a0._224_8_;
                local_214 = local_4a0._72_4_;
                local_218 = local_4a0._76_4_;
                local_21c = local_4a0._80_4_;
                local_220 = local_4a0._84_4_;
                *(undefined8 *)
                 (*(long *)local_4a0._224_8_ +
                 ((long)(local_4a0._72_4_ - (int)*(long *)(local_4a0._224_8_ + 0x20)) +
                  (long)(local_4a0._76_4_ - *(int *)(local_4a0._224_8_ + 0x24)) *
                  *(long *)(local_4a0._224_8_ + 8) +
                  (long)(local_4a0._80_4_ - (int)*(long *)(local_4a0._224_8_ + 0x28)) *
                  *(long *)(local_4a0._224_8_ + 0x10) +
                 (long)(int)local_4a0._84_4_ * *(long *)(local_4a0._224_8_ + 0x18)) * 8) = 0;
                iVar1 = local_4a0._72_4_ + 1;
              }
              iVar1 = local_4a0._76_4_ + 1;
            }
            iVar1 = local_4a0._80_4_ + 1;
          }
        }
      }
      else if (local_4a0._148_4_ == regular) {
        in_stack_fffffffffffff990 = (FabArray<amrex::FArrayBox> *)local_4a0;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff980,
                   (MFIter *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                   (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
        local_2c8 = local_398;
        local_8 = local_398;
        local_c = 0;
        local_2bc = *(int *)local_398;
        local_18 = local_398;
        local_1c = 1;
        iStack_2b8 = *(int *)((long)local_398 + 4);
        local_4c0 = *local_398;
        local_28 = local_398;
        local_2c = 2;
        local_4b8 = *(int *)(local_398 + 1);
        local_278 = local_398;
        local_68 = (int *)((long)local_398 + 0xc);
        local_6c = 0;
        local_26c = *local_68;
        local_78 = (undefined4 *)((long)local_398 + 0xc);
        local_7c = 1;
        iStack_268 = *(int *)(local_398 + 2);
        local_4e0 = *(FabArray<amrex::FArrayBox> **)local_68;
        local_88 = (undefined4 *)((long)local_398 + 0xc);
        local_8c = 2;
        local_4d8 = *(int *)((long)local_398 + 0x14);
        for (local_4e4 = 0; iVar1 = local_4b8,
            local_4cc._M_t.
            super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
                  )(__uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
                    )local_4e0, local_4c4 = local_4d8, local_4b0 = local_4c0, local_4a8 = local_4b8,
            local_4a0._64_8_ = in_stack_fffffffffffff990, local_2d8 = local_4c0,
            local_2d0 = local_4b8, local_2b4 = local_4b8, local_288 = local_4e0,
            local_280 = local_4d8, local_264 = local_4d8, local_4e4 < local_2f4;
            local_4e4 = local_4e4 + 1) {
          while (local_4e8 = iVar1, iVar1 = iStack_2b8, local_4e8 <= local_4d8) {
            while (local_4ec = iVar1, iVar1 = local_2bc, local_4ec <= iStack_268) {
              while (local_4f0 = iVar1, local_4f0 <= local_26c) {
                local_1fc = local_4f0;
                local_200 = local_4ec;
                local_204 = local_4e8;
                local_208 = local_4e4;
                local_228 = (long *)local_4a0._224_8_;
                local_22c = local_4f0;
                local_230 = local_4ec;
                local_234 = local_4e8;
                local_238 = local_4e4;
                *(_func_int **)
                 (*(long *)local_4a0._224_8_ +
                 ((long)(local_4f0 - (int)*(long *)(local_4a0._224_8_ + 0x20)) +
                  (long)(local_4ec - *(int *)(local_4a0._224_8_ + 0x24)) *
                  *(long *)(local_4a0._224_8_ + 8) +
                  (long)(local_4e8 - (int)*(long *)(local_4a0._224_8_ + 0x28)) *
                  *(long *)(local_4a0._224_8_ + 0x10) +
                 (long)local_4e4 * *(long *)(local_4a0._224_8_ + 0x18)) * 8) =
                     (in_stack_fffffffffffff990->super_FabArrayBase)._vptr_FabArrayBase
                     [(long)(local_4f0 -
                            (in_stack_fffffffffffff990->super_FabArrayBase).boxarray.m_bat.m_op.
                            m_bndryReg.m_loshft.vect[0]) +
                      (long)(local_4ec -
                            (in_stack_fffffffffffff990->super_FabArrayBase).boxarray.m_bat.m_op.
                            m_bndryReg.m_loshft.vect[1]) *
                      *(long *)&(in_stack_fffffffffffff990->super_FabArrayBase).boxarray.m_bat +
                      (long)(local_4e8 -
                            (in_stack_fffffffffffff990->super_FabArrayBase).boxarray.m_bat.m_op.
                            m_bndryReg.m_loshft.vect[2]) *
                      *(long *)((long)&(in_stack_fffffffffffff990->super_FabArrayBase).boxarray.
                                       m_bat.m_op + 4) +
                      (long)local_4e4 *
                      *(long *)((long)&(in_stack_fffffffffffff990->super_FabArrayBase).boxarray.
                                       m_bat.m_op + 0xc)];
                local_1f8 = in_stack_fffffffffffff990;
                iVar1 = local_4f0 + 1;
              }
              iVar1 = local_4ec + 1;
            }
            iVar1 = local_4e8 + 1;
          }
        }
      }
      else {
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  ((FabArray<amrex::EBCellFlagFab> *)
                   CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                   (MFIter *)in_stack_fffffffffffff970);
        local_4f8 = local_538;
        MultiCutFab::const_array(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff980,
                   (MFIter *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                   (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
        local_588 = local_5c8;
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff970);
        local_5d0 = local_5f8;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff970);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff970);
        while (bVar2 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_610,&local_628), bVar2) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    ((Box *)&stack0xfffffffffffff9bc,&local_610);
          in_stack_fffffffffffff980 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff9bc;
          local_d0 = (long *)local_4a0._224_8_;
          local_d8 = local_588;
          local_e0 = local_4f8;
          local_ec = local_2f4;
          in_stack_fffffffffffff98c = local_2f4;
          local_e8 = local_580;
          local_c8 = in_stack_fffffffffffff980;
          memcpy(local_1f0,local_4f8,0x3c);
          memcpy(auStack_1b0,local_d0,0x3c);
          memcpy(auStack_170,local_d8,0x3c);
          memcpy(auStack_130,local_e8,0x3c);
          Loop<amrex::eb_interp_cc2cent(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,int)::_lambda(int,int,int,int)_1_>
                    ((Box *)in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,
                     (anon_class_256_4_1798f1dc *)
                     CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_610);
        }
      }
      MFIter::operator++(&local_390);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffff970);
    Geometry::periodicity(in_stack_fffffffffffff9a0);
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_fffffffffffff990,in_stack_fffffffffffff98c,in_stack_fffffffffffff988,
               (Periodicity *)in_stack_fffffffffffff980,(bool)local_2f4._3_1_);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
EB_interp_CC_to_Centroid (MultiFab& cent, const MultiFab& cc, int scomp, int dcomp, int ncomp, const Geometry& geom)
{
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(cc.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& loc = factory.getCentroid();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(cc, mfi_info);  mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.validbox();
        const auto& centfab = cent.array(mfi,dcomp);
        const auto& fabtyp = flags[mfi].getType(vbx);

        if (fabtyp == FabType::covered)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( vbx, ncomp, i, j, k, n,
            {
                centfab(i,j,k,n) = 0.0;
            });
        }
        else if (fabtyp == FabType::regular)
        {
            const auto& ccfab = cc.array(mfi,scomp);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( vbx, ncomp, i, j, k, n,
            {
               centfab(i,j,k,n) = ccfab(i,j,k,n);
            });
        }
        else
        {
            const auto& flagfab = flags.const_array(mfi);
            const auto& locfab = loc.const_array(mfi);
            const auto& ccfab = cc.array(mfi,scomp);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( vbx, thread_box,
            {
                eb_interp_cc2cent(thread_box, centfab, ccfab, flagfab, locfab, ncomp);
            });
        }
    }

    cent.FillBoundary(dcomp,ncomp,geom.periodicity());

}